

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
          *this,FileDescriptor *descriptor)

{
  int iVar1;
  Descriptor *descriptor_00;
  EnumDescriptor *descriptor_01;
  FieldDescriptor *descriptor_02;
  ServiceDescriptor *descriptor_03;
  undefined4 local_28;
  undefined4 local_24;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
  *this_local;
  
  const::$_0::operator()((__0 *)this,descriptor);
  i_2 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(descriptor);
    if (iVar1 <= i_2) break;
    descriptor_00 = FileDescriptor::message_type(descriptor,i_2);
    Visit<>(this,descriptor_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = FileDescriptor::enum_type_count(descriptor);
    if (iVar1 <= i_3) break;
    descriptor_01 = FileDescriptor::enum_type(descriptor,i_3);
    Visit<>(this,descriptor_01);
    i_3 = i_3 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = FileDescriptor::extension_count(descriptor);
    if (iVar1 <= local_24) break;
    descriptor_02 = FileDescriptor::extension(descriptor,local_24);
    Visit<>(this,descriptor_02);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar1 = FileDescriptor::service_count(descriptor);
    if (iVar1 <= local_28) break;
    descriptor_03 = FileDescriptor::service(descriptor,local_28);
    Visit<>(this,descriptor_03);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void Visit(const FileDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.message_type_count(); i++) {
      Visit(*descriptor.message_type(i), message_type(proto, i)...);
    }
    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }
    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }
    for (int i = 0; i < descriptor.service_count(); i++) {
      Visit(*descriptor.service(i), service(proto, i)...);
    }
  }